

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O0

void BinaryCache::PutLexemes(char *path,Lexeme *lexStart,uint lexCount)

{
  uint uVar1;
  uint uVar2;
  CodeDescriptor *pCVar3;
  CodeDescriptor *pCVar4;
  ulong uVar5;
  Lexeme *pLVar6;
  CodeDescriptor *desc;
  uint i;
  uint hash;
  uint lexCount_local;
  Lexeme *lexStart_local;
  char *path_local;
  
  uVar1 = NULLC::GetStringHash(path);
  if (uVar1 != lastHash) {
    desc._4_4_ = 0;
    while( true ) {
      uVar2 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::size
                        ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache);
      if (uVar2 <= desc._4_4_) {
        __assert_fail("!\"module not found\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                      ,0x92,"void BinaryCache::PutLexemes(const char *, Lexeme *, unsigned int)");
      }
      pCVar3 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                         ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache,desc._4_4_)
      ;
      pCVar4 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                         ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache,desc._4_4_)
      ;
      if (uVar1 == pCVar4->nameHash) break;
      desc._4_4_ = desc._4_4_ + 1;
    }
    pCVar4 = FastVector<BinaryCache::CodeDescriptor,_false,_false>::operator[]
                       ((FastVector<BinaryCache::CodeDescriptor,_false,_false> *)cache,desc._4_4_);
    if (pCVar4->lexemes != (Lexeme *)0x0) {
      __assert_fail("!cache[i].lexemes",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/BinaryCache.cpp"
                    ,0x88,"void BinaryCache::PutLexemes(const char *, Lexeme *, unsigned int)");
    }
    uVar5 = SUB168(ZEXT416(lexCount) * ZEXT816(0x20),0);
    if (SUB168(ZEXT416(lexCount) * ZEXT816(0x20),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pLVar6 = (Lexeme *)operator_new__(uVar5);
    pCVar3->lexemes = pLVar6;
    memcpy(pCVar3->lexemes,lexStart,(ulong)lexCount << 5);
    pCVar3->lexemeCount = lexCount;
  }
  return;
}

Assistant:

void BinaryCache::PutLexemes(const char* path, Lexeme* lexStart, unsigned lexCount)
{
	unsigned int hash = NULLC::GetStringHash(path);

	if(hash == lastHash)
		return;

	for(unsigned i = 0; i < cache.size(); i++)
	{
		BinaryCache::CodeDescriptor &desc = cache[i];

		if(hash == cache[i].nameHash)
		{
			assert(!cache[i].lexemes);

			desc.lexemes = new Lexeme[lexCount];
			memcpy(desc.lexemes, lexStart, lexCount * sizeof(Lexeme));
			desc.lexemeCount = lexCount;

			return;
		}
	}

	assert(!"module not found");
}